

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

EventsPerSock * __thiscall CConnman::GenerateWaitSockets(CConnman *this,Span<CNode_*const> nodes)

{
  CNode *pCVar1;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  CNode **ppCVar5;
  Mutex *this_00;
  __tuple_element_t<1UL,_tuple<Span<const_unsigned_char>,_bool,_const_basic_string<char,_char_traits<char>,_allocator<char>_>_&>_>
  *p_Var6;
  EventsPerSock *in_RDI;
  long in_FS_OFFSET;
  pair<std::__detail::_Node_iterator<std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>,_false,_true>,_bool>
  pVar7;
  Event event;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *_msg_type;
  type *more;
  type *to_send;
  bool select_send;
  bool select_recv;
  CNode *pnode;
  CNode **__end1_1;
  CNode **__begin1_1;
  Span<CNode_*const> *__range1_1;
  ListenSocket *hListenSocket;
  vector<CConnman::ListenSocket,_std::allocator<CConnman::ListenSocket>_> *__range1;
  EventsPerSock *events_per_sock;
  iterator __end1;
  iterator __begin1;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock67;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock66;
  __shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2> *in_stack_fffffffffffffe68;
  vector<CConnman::ListenSocket,_std::allocator<CConnman::ListenSocket>_> *in_stack_fffffffffffffe70
  ;
  undefined7 in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe7f;
  _Node_iterator_base<std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>,_true>
  in_stack_fffffffffffffe80;
  shared_ptr<Sock> *in_stack_fffffffffffffe88;
  Mutex *in_stack_fffffffffffffe90;
  pointer in_stack_fffffffffffffe98;
  undefined7 in_stack_fffffffffffffea0;
  byte in_stack_fffffffffffffea7;
  CNode **local_e0;
  undefined1 local_90 [40];
  ListenSocket *local_68;
  ListenSocket *local_60;
  _Node_iterator_base<std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>,_true> local_48;
  undefined1 local_40;
  _Node_iterator_base<std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>,_true> local_18;
  undefined1 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  unordered_map<std::shared_ptr<const_Sock>,_Sock::Events,_Sock::HashSharedPtrSock,_Sock::EqualSharedPtrSock,_std::allocator<std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>_>_>
  ::unordered_map((unordered_map<std::shared_ptr<const_Sock>,_Sock::Events,_Sock::HashSharedPtrSock,_Sock::EqualSharedPtrSock,_std::allocator<std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>_>_>
                   *)in_stack_fffffffffffffe68);
  local_60 = (ListenSocket *)
             std::vector<CConnman::ListenSocket,_std::allocator<CConnman::ListenSocket>_>::begin
                       (in_stack_fffffffffffffe70);
  local_68 = (ListenSocket *)
             std::vector<CConnman::ListenSocket,_std::allocator<CConnman::ListenSocket>_>::end
                       (in_stack_fffffffffffffe70);
  while (bVar2 = __gnu_cxx::
                 operator==<CConnman::ListenSocket_*,_std::vector<CConnman::ListenSocket,_std::allocator<CConnman::ListenSocket>_>_>
                           ((__normal_iterator<CConnman::ListenSocket_*,_std::vector<CConnman::ListenSocket,_std::allocator<CConnman::ListenSocket>_>_>
                             *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),
                            (__normal_iterator<CConnman::ListenSocket_*,_std::vector<CConnman::ListenSocket,_std::allocator<CConnman::ListenSocket>_>_>
                             *)in_stack_fffffffffffffe70), ((bVar2 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<CConnman::ListenSocket_*,_std::vector<CConnman::ListenSocket,_std::allocator<CConnman::ListenSocket>_>_>
    ::operator*((__normal_iterator<CConnman::ListenSocket_*,_std::vector<CConnman::ListenSocket,_std::allocator<CConnman::ListenSocket>_>_>
                 *)in_stack_fffffffffffffe68);
    Sock::Events::Events((Events *)in_stack_fffffffffffffe68,'\0');
    pVar7 = std::
            unordered_map<std::shared_ptr<Sock_const>,Sock::Events,Sock::HashSharedPtrSock,Sock::EqualSharedPtrSock,std::allocator<std::pair<std::shared_ptr<Sock_const>const,Sock::Events>>>
            ::emplace<std::shared_ptr<Sock>const&,Sock::Events>
                      ((unordered_map<std::shared_ptr<const_Sock>,_Sock::Events,_Sock::HashSharedPtrSock,_Sock::EqualSharedPtrSock,_std::allocator<std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>_>_>
                        *)in_stack_fffffffffffffe88,
                       (shared_ptr<Sock> *)in_stack_fffffffffffffe80._M_cur,
                       (Events *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
    local_18._M_cur =
         (__node_type *)
         pVar7.first.
         super__Node_iterator_base<std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>,_true>
         ._M_cur;
    local_10 = pVar7.second;
    __gnu_cxx::
    __normal_iterator<CConnman::ListenSocket_*,_std::vector<CConnman::ListenSocket,_std::allocator<CConnman::ListenSocket>_>_>
    ::operator++((__normal_iterator<CConnman::ListenSocket_*,_std::vector<CConnman::ListenSocket,_std::allocator<CConnman::ListenSocket>_>_>
                  *)in_stack_fffffffffffffe68);
  }
  local_e0 = Span<CNode_*const>::begin((Span<CNode_*const> *)in_stack_fffffffffffffe68);
  ppCVar5 = Span<CNode_*const>::end((Span<CNode_*const> *)in_stack_fffffffffffffe68);
  for (; local_e0 != ppCVar5; local_e0 = local_e0 + 1) {
    pCVar1 = *local_e0;
    bVar2 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_fffffffffffffe80._M_cur);
    this_00 = MaybeCheckNotHeld((Mutex *)in_stack_fffffffffffffe68);
    UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
              ((UniqueLock<AnnotatedMixin<std::mutex>_> *)this_00,
               (AnnotatedMixin<std::mutex> *)
               CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
               (char *)in_stack_fffffffffffffe98,(char *)in_stack_fffffffffffffe90,
               (int)((ulong)in_stack_fffffffffffffe88 >> 0x20),
               SUB81((ulong)in_stack_fffffffffffffe88 >> 0x18,0));
    in_stack_fffffffffffffe98 =
         std::unique_ptr<Transport,_std::default_delete<Transport>_>::operator->
                   ((unique_ptr<Transport,_std::default_delete<Transport>_> *)
                    in_stack_fffffffffffffe68);
    bVar3 = std::deque<CSerializedNetMsg,_std::allocator<CSerializedNetMsg>_>::empty
                      ((deque<CSerializedNetMsg,_std::allocator<CSerializedNetMsg>_> *)
                       in_stack_fffffffffffffe68);
    (*in_stack_fffffffffffffe98->_vptr_Transport[7])
              (local_90,in_stack_fffffffffffffe98,(ulong)((bVar3 ^ 0xff) & 1));
    std::get<0ul,Span<unsigned_char_const>,bool,std::__cxx11::string_const&>
              ((tuple<Span<const_unsigned_char>,_bool,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)in_stack_fffffffffffffe68);
    p_Var6 = std::get<1ul,Span<unsigned_char_const>,bool,std::__cxx11::string_const&>
                       ((tuple<Span<const_unsigned_char>,_bool,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                         *)in_stack_fffffffffffffe68);
    std::get<2ul,Span<unsigned_char_const>,bool,std::__cxx11::string_const&>
              ((tuple<Span<const_unsigned_char>,_bool,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)in_stack_fffffffffffffe68);
    bVar3 = Span<const_unsigned_char>::empty((Span<const_unsigned_char> *)in_stack_fffffffffffffe68)
    ;
    in_stack_fffffffffffffea7 = 1;
    if (bVar3) {
      in_stack_fffffffffffffea7 = *p_Var6;
    }
    bVar4 = in_stack_fffffffffffffea7 & 1;
    UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
              ((UniqueLock<AnnotatedMixin<std::mutex>_> *)in_stack_fffffffffffffe68);
    if ((!bVar2) || (bVar4 != 0)) {
      in_stack_fffffffffffffe90 = MaybeCheckNotHeld((Mutex *)in_stack_fffffffffffffe68);
      UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
                ((UniqueLock<AnnotatedMixin<std::mutex>_> *)this_00,
                 (AnnotatedMixin<std::mutex> *)
                 CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
                 (char *)in_stack_fffffffffffffe98,(char *)in_stack_fffffffffffffe90,
                 (int)((ulong)in_stack_fffffffffffffe88 >> 0x20),
                 SUB81((ulong)in_stack_fffffffffffffe88 >> 0x18,0));
      bVar2 = std::__shared_ptr::operator_cast_to_bool(in_stack_fffffffffffffe68);
      if (bVar2) {
        in_stack_fffffffffffffe88 = &pCVar1->m_sock;
        Sock::Events::Events((Events *)in_stack_fffffffffffffe68,'\0');
        pVar7 = std::
                unordered_map<std::shared_ptr<Sock_const>,Sock::Events,Sock::HashSharedPtrSock,Sock::EqualSharedPtrSock,std::allocator<std::pair<std::shared_ptr<Sock_const>const,Sock::Events>>>
                ::emplace<std::shared_ptr<Sock>&,Sock::Events>
                          ((unordered_map<std::shared_ptr<const_Sock>,_Sock::Events,_Sock::HashSharedPtrSock,_Sock::EqualSharedPtrSock,_std::allocator<std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>_>_>
                            *)in_stack_fffffffffffffe88,
                           (shared_ptr<Sock> *)in_stack_fffffffffffffe80._M_cur,
                           (Events *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
        in_stack_fffffffffffffe80._M_cur =
             (__node_type *)
             pVar7.first.
             super__Node_iterator_base<std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>,_true>
             ._M_cur;
        in_stack_fffffffffffffe7f = pVar7.second;
        local_48._M_cur = in_stack_fffffffffffffe80._M_cur;
        local_40 = in_stack_fffffffffffffe7f;
      }
      UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
                ((UniqueLock<AnnotatedMixin<std::mutex>_> *)in_stack_fffffffffffffe68);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

Sock::EventsPerSock CConnman::GenerateWaitSockets(Span<CNode* const> nodes)
{
    Sock::EventsPerSock events_per_sock;

    for (const ListenSocket& hListenSocket : vhListenSocket) {
        events_per_sock.emplace(hListenSocket.sock, Sock::Events{Sock::RECV});
    }

    for (CNode* pnode : nodes) {
        bool select_recv = !pnode->fPauseRecv;
        bool select_send;
        {
            LOCK(pnode->cs_vSend);
            // Sending is possible if either there are bytes to send right now, or if there will be
            // once a potential message from vSendMsg is handed to the transport. GetBytesToSend
            // determines both of these in a single call.
            const auto& [to_send, more, _msg_type] = pnode->m_transport->GetBytesToSend(!pnode->vSendMsg.empty());
            select_send = !to_send.empty() || more;
        }
        if (!select_recv && !select_send) continue;

        LOCK(pnode->m_sock_mutex);
        if (pnode->m_sock) {
            Sock::Event event = (select_send ? Sock::SEND : 0) | (select_recv ? Sock::RECV : 0);
            events_per_sock.emplace(pnode->m_sock, Sock::Events{event});
        }
    }

    return events_per_sock;
}